

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::BasicSharedSimple::RunIteration
          (BasicSharedSimple *this,GLuint num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  uint uVar1;
  void *pvVar2;
  GLuint GVar3;
  ulong __n;
  bool bVar4;
  ulong uVar5;
  GLuint groups [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  allocator_type local_5d;
  value_type_conflict4 local_5c;
  undefined1 *local_58;
  GLuint *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  __n = (ulong)(num_groups << 7);
  local_5c = 0xffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,__n,&local_5c,&local_5d);
  local_50 = &this->m_storage_buffer;
  GVar3 = this->m_storage_buffer;
  if (GVar3 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,local_50);
    GVar3 = *local_50;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar3);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,__n * 4,
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    local_58 = &DAT_100000001;
    GVar3 = this->m_dispatch_buffer;
    local_5c = num_groups;
    if (GVar3 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar3 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar3);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_5c,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,num_groups,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*local_50);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  pvVar2 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,__n * 4,1);
  if (num_groups == 0) {
    bVar4 = true;
  }
  else {
    bVar4 = true;
    uVar5 = 0;
    do {
      uVar1 = *(uint *)((long)pvVar2 + uVar5 * 4);
      if (uVar1 != 1) {
        bVar4 = false;
        anon_unknown_0::Output
                  ("Data at index %d is %d should be %d.\n",uVar5 & 0xffffffff,(ulong)uVar1,1);
      }
      uVar5 = uVar5 + 1;
    } while (__n != uVar5);
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool RunIteration(const GLuint num_groups, bool dispatch_indirect)
	{
		const GLuint kBufferSize = 128 * num_groups;

		std::vector<GLuint> data(kBufferSize, 0xffff);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { num_groups, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLuint* result;
		result = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (result[i] != 1)
			{
				Output("Data at index %d is %d should be %d.\n", i, result[i], 1);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}